

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O0

Pipeline * __thiscall
capnp::
Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
::sendForPipeline(Pipeline *__return_storage_ptr__,
                 Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
                 *this)

{
  RequestHook *pRVar1;
  Pipeline *typeless;
  undefined1 local_40 [8];
  Pipeline typelessPipeline;
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  *this_local;
  
  typelessPipeline.ops.disposer = (ArrayDisposer *)this;
  pRVar1 = kj::Own<capnp::RequestHook,_std::nullptr_t>::operator->(&this->hook);
  (*pRVar1->_vptr_RequestHook[2])(local_40);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::operator=(&this->hook,(void *)0x0);
  typeless = kj::mv<capnp::AnyPointer::Pipeline>((Pipeline *)local_40);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::Pipeline
            (__return_storage_ptr__,typeless);
  AnyPointer::Pipeline::~Pipeline((Pipeline *)local_40);
  return __return_storage_ptr__;
}

Assistant:

typename Results::Pipeline Request<Params, Results>::sendForPipeline() {
  auto typelessPipeline = hook->sendForPipeline();
  hook = nullptr;  // prevent reuse
  return typename Results::Pipeline(kj::mv(typelessPipeline));
}